

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTypes.h
# Opt level: O1

bool __thiscall MiniScript::Value::operator==(Value *this,Value *rhs)

{
  long *plVar1;
  StringStorage *lhs;
  StringStorage *rhs_00;
  SeqElemStorage *lhs_00;
  SeqElemStorage *rhs_01;
  bool bVar2;
  Value local_30;
  Value local_20;
  
  local_30.type = rhs->type;
  if (this->type == local_30.type) {
    bVar2 = true;
    switch(this->type) {
    case Null:
      goto switchD_00120c43_caseD_0;
    case Number:
      return (bool)(-((rhs->data).number == (this->data).number) & 1);
    case Temp:
      return (this->data).tempNum == (rhs->data).tempNum;
    case String:
    case Var:
      lhs = (StringStorage *)(this->data).ref;
      rhs_00 = (StringStorage *)(rhs->data).ref;
      if (lhs == rhs_00) {
        return true;
      }
      if (rhs_00 != (StringStorage *)0x0 && lhs != (StringStorage *)0x0) {
        bVar2 = Equal(lhs,rhs_00);
        return bVar2;
      }
      break;
    case List:
      if ((this->data).ref == (rhs->data).ref) {
        return true;
      }
      if ((rhs->data).ref != (RefCountedStorage *)0x0 &&
          (this->data).ref != (RefCountedStorage *)0x0) {
        local_20.noInvoke = rhs->noInvoke;
        local_20.localOnly = rhs->localOnly;
        local_20.data = (anon_union_8_3_2f476f46_for_data)(rhs->data).ref;
        if ((Temp < local_30.type) && (local_20.data.ref != (RefCountedStorage *)0x0)) {
          (local_20.data.ref)->refCount = (local_20.data.ref)->refCount + 1;
        }
        local_20.type = local_30.type;
        bVar2 = RecursiveEqual(this,&local_20);
        if (local_20.type < String) {
          return bVar2;
        }
        if (local_20.data.ref == (RefCountedStorage *)0x0) {
          return bVar2;
        }
        plVar1 = &(local_20.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 != 0) {
          return bVar2;
        }
        (*(local_20.data.ref)->_vptr_RefCountedStorage[1])();
        return bVar2;
      }
      break;
    case Map:
      if ((this->data).ref == (rhs->data).ref) {
        return true;
      }
      if ((rhs->data).ref != (RefCountedStorage *)0x0 &&
          (this->data).ref != (RefCountedStorage *)0x0) {
        local_30.noInvoke = rhs->noInvoke;
        local_30.localOnly = rhs->localOnly;
        local_30.data = (anon_union_8_3_2f476f46_for_data)(rhs->data).ref;
        if ((Temp < local_30.type) && (local_30.data.ref != (RefCountedStorage *)0x0)) {
          (local_30.data.ref)->refCount = (local_30.data.ref)->refCount + 1;
        }
        bVar2 = RecursiveEqual(this,&local_30);
        if (local_30.type < String) {
          return bVar2;
        }
        if (local_30.data.ref == (RefCountedStorage *)0x0) {
          return bVar2;
        }
        plVar1 = &(local_30.data.ref)->refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 != 0) {
          return bVar2;
        }
        (*(local_30.data.ref)->_vptr_RefCountedStorage[1])();
        return bVar2;
      }
      break;
    case Function:
    case Handle:
      return (this->data).ref == (rhs->data).ref;
    case SeqElem:
      lhs_00 = (SeqElemStorage *)(this->data).ref;
      rhs_01 = (SeqElemStorage *)(rhs->data).ref;
      if (lhs_00 == rhs_01) {
        return true;
      }
      if (rhs_01 != (SeqElemStorage *)0x0 && lhs_00 != (SeqElemStorage *)0x0) {
        bVar2 = Equal(lhs_00,rhs_01);
        return bVar2;
      }
    }
  }
  bVar2 = false;
switchD_00120c43_caseD_0:
  return bVar2;
}

Assistant:

inline bool Value::operator==(const Value& rhs) const {
		if (type != rhs.type) return false;
		switch (type) {
			case ValueType::Null:
				return true;		// null values are always equal
				
			case ValueType::Number:
				return data.number == rhs.data.number;
				
			case ValueType::String:
			case ValueType::Var:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return Equal((StringStorage*)data.ref, (StringStorage*)rhs.data.ref);
			}
			case ValueType::List:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return RecursiveEqual(rhs);
			}
			case ValueType::Map:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return RecursiveEqual(rhs);
			}
			case ValueType::Function:
				// Two functions are equal only if they refer to the exact same function
				return (data.ref == rhs.data.ref);

			case ValueType::Temp:
				return (data.tempNum == rhs.data.tempNum);
				
			case ValueType::SeqElem:
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return Equal((SeqElemStorage*)data.ref, (SeqElemStorage*)rhs.data.ref);
			
			case ValueType::Handle:
				return (data.ref == rhs.data.ref);
		}
		return false;
	}